

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

bool __thiscall kmp_flag_oncore::notdone_check(kmp_flag_oncore *this)

{
  unsigned_long_long *loc;
  uchar *puVar1;
  kmp_flag_oncore *in_RDI;
  kmp_flag_64 flag;
  kmp_uint64 *in_stack_ffffffffffffffb8;
  kmp_flag_64 *in_stack_ffffffffffffffc8;
  kmp_info_t *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (in_RDI->this_thr->th_pad[(ulong)in_RDI->bt * 0x100 + 0x23f] == '\x03') {
    in_RDI->flag_switch = true;
  }
  loc = kmp_flag<unsigned_long_long>::get(&in_RDI->super_kmp_flag<unsigned_long_long>);
  puVar1 = byteref(in_RDI,loc,(ulong)in_RDI->offset);
  if ((*puVar1 == '\x01') || ((in_RDI->flag_switch & 1U) != 0)) {
    if ((in_RDI->flag_switch & 1U) != 0) {
      in_RDI->this_thr->th_pad[(ulong)in_RDI->bt * 0x100 + 0x23f] = '\x04';
      kmp_flag_64::kmp_flag_64((kmp_flag_64 *)in_RDI,in_stack_ffffffffffffffb8,0x17dec0);
      __kmp_wait_64(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20)
                    ,in_stack_ffffffffffffffb8);
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool notdone_check() {
        // Calculate flag_switch
        if (this_thr->th.th_bar[bt].bb.wait_flag == KMP_BARRIER_SWITCH_TO_OWN_FLAG)
            flag_switch = true;
        if (byteref(get(),offset) != 1 && !flag_switch)
            return true;
        else if (flag_switch) {
            this_thr->th.th_bar[bt].bb.wait_flag = KMP_BARRIER_SWITCHING;
            kmp_flag_64 flag(&this_thr->th.th_bar[bt].bb.b_go, (kmp_uint64)KMP_BARRIER_STATE_BUMP);
            __kmp_wait_64(this_thr, &flag, TRUE
#if USE_ITT_BUILD
                          , itt_sync_obj
#endif
                          );
        }
        return false;
    }